

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O3

ON_Layer *
ON_Layer::FromModelComponentRef
          (ON_ModelComponentReference *model_component_reference,ON_Layer *none_return_value)

{
  bool bVar1;
  ON_Layer *this;
  ON_Layer *pOVar2;
  
  this = (ON_Layer *)ON_ModelComponentReference::ModelComponent(model_component_reference);
  if (this == (ON_Layer *)0x0) {
    pOVar2 = (ON_Layer *)0x0;
  }
  else {
    bVar1 = ON_Object::IsKindOf((ON_Object *)this,&m_ON_Layer_class_rtti);
    pOVar2 = (ON_Layer *)0x0;
    if (bVar1) {
      pOVar2 = this;
    }
  }
  if (pOVar2 != (ON_Layer *)0x0) {
    none_return_value = pOVar2;
  }
  return none_return_value;
}

Assistant:

const ON_Layer* ON_Layer::FromModelComponentRef(
  const class ON_ModelComponentReference& model_component_reference,
  const ON_Layer* none_return_value
  )
{
  const ON_Layer* p = ON_Layer::Cast(model_component_reference.ModelComponent());
  return (nullptr != p) ? p : none_return_value;
}